

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O0

bool __thiscall
Assimp::ObjExporter::aiVectorCompare::operator()(aiVectorCompare *this,aiVector3D *a,aiVector3D *b)

{
  aiVector3D *b_local;
  aiVector3D *a_local;
  aiVectorCompare *this_local;
  
  if (b->x <= a->x) {
    if (a->x < b->x || a->x == b->x) {
      if (b->y <= a->y) {
        if (a->y < b->y || a->y == b->y) {
          if (b->z <= a->z) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const aiVector3D& a, const aiVector3D& b) const { 
            if(a.x < b.x) return true; 
            if(a.x > b.x) return false; 
            if(a.y < b.y) return true; 
            if(a.y > b.y) return false; 
            if(a.z < b.z) return true; 
            return false;
        }